

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiekeypath.cpp
# Opt level: O0

bool __thiscall LOTKeyPath::fullyResolvesTo(LOTKeyPath *this,string *key,uint32_t depth)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  size_t sVar4;
  ulong uVar5;
  uint in_EDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool bVar6;
  bool isGlobstarButNextKeyMatches;
  bool matches;
  bool isLastDepth;
  undefined8 in_stack_ffffffffffffff88;
  uint32_t depth_00;
  LOTKeyPath *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  bool local_41;
  
  depth_00 = (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar3 < in_EDX) {
    return false;
  }
  sVar4 = size((LOTKeyPath *)0x1aca69);
  bVar6 = in_EDX != sVar4;
  bVar1 = isGlobstar(in_stack_ffffffffffffff90,depth_00);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,(ulong)in_EDX);
    _Var2 = std::operator==(in_stack_ffffffffffffffb0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffaf,
                                     CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)))
    ;
    local_41 = true;
    if (!_Var2) {
      local_41 = isGlob(in_stack_ffffffffffffff90,depth_00);
    }
    if (bVar6) {
      uVar5 = (ulong)in_EDX;
      sVar4 = size((LOTKeyPath *)0x1acaf3);
      if (uVar5 != sVar4 - 1) {
        return false;
      }
      bVar1 = endsWithGlobstar((LOTKeyPath *)0x1acb14);
      if (!bVar1) {
        return false;
      }
    }
    return local_41;
  }
  uVar7 = false;
  if (bVar6) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,(ulong)(in_EDX + 1));
    uVar7 = std::operator==(in_stack_ffffffffffffffb0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffae,
                                                    in_stack_ffffffffffffffa8)));
  }
  if ((__type)uVar7 == false) {
    if (!bVar6) {
      return true;
    }
    uVar5 = (ulong)(in_EDX + 1);
    sVar4 = size((LOTKeyPath *)0x1acc19);
    if (sVar4 <= uVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,(ulong)(in_EDX + 1));
      _Var2 = std::operator==(in_stack_ffffffffffffffb0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffae,
                                                      in_stack_ffffffffffffffa8)));
      return _Var2;
    }
    return false;
  }
  sVar4 = size((LOTKeyPath *)0x1acb91);
  if ((ulong)in_EDX == sVar4 - 1) {
    return true;
  }
  uVar5 = (ulong)in_EDX;
  sVar4 = size((LOTKeyPath *)0x1acbbb);
  if (uVar5 == sVar4 - 2) {
    bVar1 = endsWithGlobstar((LOTKeyPath *)0x1acbdc);
    return bVar1;
  }
  return false;
}

Assistant:

bool LOTKeyPath::fullyResolvesTo(const std::string key, uint32_t depth)
{
    if (depth > mKeys.size()) {
        return false;
    }

    bool isLastDepth = (depth == size());

    if (!isGlobstar(depth)) {
        bool matches = (mKeys[depth] == key) || isGlob(depth);
        return (isLastDepth || (depth == size() - 1 && endsWithGlobstar())) &&
               matches;
    }

    bool isGlobstarButNextKeyMatches = !isLastDepth && mKeys[depth + 1] == key;
    if (isGlobstarButNextKeyMatches) {
        return depth == size() - 1 ||
               (depth == size() - 2 && endsWithGlobstar());
    }

    if (isLastDepth) {
        return true;
    }

    if (depth + 1 < size()) {
        // We are a globstar but there is more than 1 key after the globstar we
        // we can't fully match.
        return false;
    }
    // Return whether the next key (which we now know is the last one) is the
    // same as the current key.
    return mKeys[depth + 1] == key;
}